

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::(anonymous_namespace)::
DatarateTestSVC_BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles_Test::
~DatarateTestSVC_BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles_Test
          (DatarateTestSVC_BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles_Test *this)

{
  DatarateTestSVC_BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles_Test *unaff_retaddr;
  
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles_Test(unaff_retaddr);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTiles) {
  BasicRateTargetingSVC2TL1SLHDMultiThread4AutoTilesTest();
}